

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTarget.cpp
# Opt level: O1

void __thiscall
sf::RenderTarget::setupDraw(RenderTarget *this,bool useVertexCache,RenderStates *states)

{
  bool bVar1;
  Uint64 UVar2;
  socklen_t extraout_EDX;
  socklen_t extraout_EDX_00;
  socklen_t extraout_EDX_01;
  socklen_t __len;
  RenderStates *right;
  RenderTarget *this_00;
  Texture *pTVar3;
  
  this_00 = this;
  if ((this->m_cache).glStatesSet == false) {
    resetGLStates(this);
  }
  if (useVertexCache) {
    if (((this->m_cache).enable != true) || ((this->m_cache).useVertexCache == false)) {
      glLoadIdentity();
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/RenderTarget.cpp"
                         ,0x297,"glLoadIdentity()");
    }
  }
  else {
    applyTransform(this_00,&states->transform);
  }
  if (((this->m_cache).enable != true) || ((this->m_cache).viewChanged == true)) {
    applyCurrentView(this);
  }
  if ((this->m_cache).enable == true) {
    right = (RenderStates *)&(this->m_cache).lastBlendMode;
    bVar1 = operator!=(&states->blendMode,(BlendMode *)right);
    __len = extraout_EDX;
    if (bVar1) goto LAB_00139b20;
  }
  else {
LAB_00139b20:
    right = states;
    applyBlendMode(this,&states->blendMode);
    __len = extraout_EDX_00;
  }
  if ((this->m_cache).enable == true) {
    pTVar3 = states->texture;
    if (pTVar3 == (Texture *)0x0) {
LAB_00139b56:
      UVar2 = 0;
    }
    else {
      if (pTVar3->m_fboAttachment == true) goto LAB_00139b45;
      if (pTVar3 == (Texture *)0x0) goto LAB_00139b56;
      UVar2 = pTVar3->m_cacheId;
    }
    if (UVar2 == (this->m_cache).lastTextureId) goto LAB_00139b82;
  }
  else {
LAB_00139b45:
    pTVar3 = states->texture;
  }
  right = (RenderStates *)0x1;
  Texture::bind((int)pTVar3,(sockaddr *)0x1,__len);
  if (pTVar3 == (Texture *)0x0) {
    UVar2 = 0;
  }
  else {
    UVar2 = pTVar3->m_cacheId;
  }
  (this->m_cache).lastTextureId = UVar2;
  __len = extraout_EDX_01;
LAB_00139b82:
  if (states->shader != (Shader *)0x0) {
    Shader::bind((int)states->shader,(sockaddr *)right,__len);
    return;
  }
  return;
}

Assistant:

void RenderTarget::setupDraw(bool useVertexCache, const RenderStates& states)
{
    // First set the persistent OpenGL states if it's the very first call
    if (!m_cache.glStatesSet)
        resetGLStates();

    if (useVertexCache)
    {
        // Since vertices are transformed, we must use an identity transform to render them
        if (!m_cache.enable || !m_cache.useVertexCache)
            glCheck(glLoadIdentity());
    }
    else
    {
        applyTransform(states.transform);
    }

    // Apply the view
    if (!m_cache.enable || m_cache.viewChanged)
        applyCurrentView();

    // Apply the blend mode
    if (!m_cache.enable || (states.blendMode != m_cache.lastBlendMode))
        applyBlendMode(states.blendMode);

    // Apply the texture
    if (!m_cache.enable || (states.texture && states.texture->m_fboAttachment))
    {
        // If the texture is an FBO attachment, always rebind it
        // in order to inform the OpenGL driver that we want changes
        // made to it in other contexts to be visible here as well
        // This saves us from having to call glFlush() in
        // RenderTextureImplFBO which can be quite costly
        // See: https://www.khronos.org/opengl/wiki/Memory_Model
        applyTexture(states.texture);
    }
    else
    {
        Uint64 textureId = states.texture ? states.texture->m_cacheId : 0;
        if (textureId != m_cache.lastTextureId)
            applyTexture(states.texture);
    }

    // Apply the shader
    if (states.shader)
        applyShader(states.shader);
}